

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[35],kj::Exception_const&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [35],Exception *params_1,
          char *params_2)

{
  char (*value) [35];
  kj *this_00;
  char *value_00;
  Exception *value_01;
  char local_51 [1];
  String local_50;
  ArrayPtr<const_char> local_38;
  Exception *local_28;
  char *params_local_2;
  Exception *params_local_1;
  char (*params_local) [35];
  
  local_28 = params_1;
  params_local_2 = *params;
  params_local_1 = (Exception *)this;
  params_local = (char (*) [35])__return_storage_ptr__;
  value = ::const((char (*) [35])this);
  local_38 = toCharSequence<char_const(&)[35]>(value);
  this_00 = (kj *)fwd<kj::Exception_const&>((Exception *)params_local_2);
  toCharSequence<kj::Exception_const&>(&local_50,this_00,value_01);
  value_00 = fwd<char>((NoInfer<char> *)local_28);
  local_51[0] = (char)toCharSequence<char>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_50,
             (String *)local_51,(FixedArray<char,_1UL> *)params_2);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}